

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptpubkey_multisig_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t threshold,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  ulong __nmemb;
  ulong uVar1;
  size_t sVar2;
  undefined1 local_248 [8];
  uchar pubkey_bytes [495];
  ulong local_50;
  size_t i;
  size_t script_len;
  size_t n_pubkeys;
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  uint32_t threshold_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  __nmemb = bytes_len / 0x21;
  uVar1 = __nmemb * 0x22 + 3;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((((((bytes == (uchar *)0x0) || (bytes_len == 0)) || (bytes_len % 0x21 != 0)) ||
       ((__nmemb == 0 || (0xf < __nmemb)))) ||
      ((threshold == 0 || ((0xf < threshold || (__nmemb < threshold)))))) ||
     (((flags & 0xfffffff7) != 0 || ((bytes_out == (uchar *)0x0 || (written == (size_t *)0x0)))))) {
    bytes_local._4_4_ = -2;
  }
  else if (len < uVar1) {
    *written = uVar1;
    bytes_local._4_4_ = 0;
  }
  else {
    memcpy(local_248,bytes,bytes_len);
    if ((flags & 8) != 0) {
      qsort(local_248,__nmemb,0x21,pubkey_compare);
    }
    sVar2 = value_to_op_n((ulong)threshold);
    len_local = (size_t)(bytes_out + 1);
    *bytes_out = (uchar)sVar2;
    for (local_50 = 0; local_50 < __nmemb; local_50 = local_50 + 1) {
      *(undefined1 *)len_local = 0x21;
      memcpy((void *)(len_local + 1),local_248 + local_50 * 0x21,0x21);
      len_local = len_local + 0x22;
    }
    wally_clear(local_248,0x1ef);
    sVar2 = value_to_op_n(__nmemb);
    *(char *)len_local = (char)sVar2;
    *(undefined1 *)(len_local + 1) = 0xae;
    *written = uVar1;
    bytes_local._4_4_ = 0;
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_scriptpubkey_multisig_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t threshold,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t n_pubkeys = bytes_len / EC_PUBLIC_KEY_LEN;
    size_t script_len = 3 + (n_pubkeys * (EC_PUBLIC_KEY_LEN + 1));
    size_t i;
    unsigned char pubkey_bytes[15 * EC_PUBLIC_KEY_LEN];

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || bytes_len % EC_PUBLIC_KEY_LEN ||
        n_pubkeys < 1 || n_pubkeys > 15 || threshold < 1 || threshold > 15 ||
        threshold > n_pubkeys || (flags & ~WALLY_SCRIPT_MULTISIG_SORTED) ||
        !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    memcpy(pubkey_bytes, bytes, bytes_len);
    if (flags & WALLY_SCRIPT_MULTISIG_SORTED) {
        qsort(pubkey_bytes, n_pubkeys, EC_PUBLIC_KEY_LEN, pubkey_compare);
    }

    *bytes_out++ = value_to_op_n(threshold);
    for (i = 0; i < n_pubkeys; ++i) {
        *bytes_out++ = EC_PUBLIC_KEY_LEN;
        memcpy(bytes_out, pubkey_bytes + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
        bytes_out += EC_PUBLIC_KEY_LEN;
    }
    wally_clear(pubkey_bytes, sizeof(pubkey_bytes));
    *bytes_out++ = value_to_op_n(n_pubkeys);
    *bytes_out = OP_CHECKMULTISIG;
    *written = script_len;
    return WALLY_OK;
}